

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.cpp
# Opt level: O0

SidTreeNode * __thiscall
COLLADASaxFWL::DocumentProcessor::resolveSid(DocumentProcessor *this,SidAddress *sidAddress)

{
  bool bVar1;
  __type _Var2;
  SidTreeNode *pSVar3;
  ulong uVar4;
  SidList *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  SidAddress *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  SidTreeNode *childNode;
  String *currentSid;
  size_t count;
  size_t i;
  SidList *sids;
  SidTreeNode *currentNode;
  String *id;
  SidTreeNode *startingPoint;
  size_t in_stack_00000090;
  SidAddress *in_stack_00000098;
  SidTreeNode *in_stack_000000a0;
  DocumentProcessor *in_stack_000000a8;
  String *in_stack_ffffffffffffffb0;
  DocumentProcessor *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  SidTreeNode *local_20;
  SidTreeNode *local_8;
  
  bVar1 = SidAddress::isValid(in_RSI);
  if (bVar1) {
    local_20 = (SidTreeNode *)0x0;
    pSVar3 = (SidTreeNode *)SidAddress::getId_abi_cxx11_(in_RSI);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_20 = findSidTreeNodeByStringId(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    }
    if (local_20 == (SidTreeNode *)0x0) {
      local_8 = (SidTreeNode *)0x0;
    }
    else {
      local_8 = local_20;
      this_00 = SidAddress::getSids_abi_cxx11_(in_RSI);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffffb0);
      if (!bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::front(in_RDI);
        SidTreeNode::getSid_abi_cxx11_(local_20);
        _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_ffffffffffffffb8);
        if (_Var2) {
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        }
      }
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(this_00);
      for (; __lhs < pbVar5;
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &__lhs->field_0x1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](this_00,(size_type)__lhs);
        local_8 = SidTreeNode::findChildBySid(pSVar3,(String *)local_8);
        if (local_8 == (SidTreeNode *)0x0) {
          pSVar3 = resolveSidInInstance
                             (in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                              in_stack_00000090);
          return pSVar3;
        }
      }
    }
  }
  else {
    local_8 = (SidTreeNode *)0x0;
  }
  return local_8;
}

Assistant:

const SidTreeNode* DocumentProcessor::resolveSid( const SidAddress& sidAddress )
	{
		if ( !sidAddress.isValid() )
			return 0;

		SidTreeNode* startingPoint = 0;
		const String& id = sidAddress.getId();
		if ( !id.empty() )
		{
			// search for element with id 
			startingPoint = findSidTreeNodeByStringId( id );
		}

		if ( !startingPoint )
			return 0;

		SidTreeNode* currentNode = startingPoint;
		const SidAddress::SidList& sids = sidAddress.getSids();

		size_t i = 0;

		if ( !sids.empty() && (sids.front() == startingPoint->getSid()) )
		{
			// the first one is the start element it self exclude it from recursive search
			i = 1;
		}

		for ( size_t count = sids.size(); i < count; ++i)
		{
			const String& currentSid = sids[i];
			SidTreeNode* childNode = currentNode->findChildBySid( currentSid );

			if ( !childNode )
			{
				// we could not find the sid as a child of currentNode
				// lets try if the sid is in an instantiated element
				return resolveSidInInstance( currentNode, sidAddress, i);
			}
			else
			{
				currentNode = childNode;
			}
		}
		return currentNode;
	}